

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O2

void __thiscall
llvm::SmallPtrSetImplBase::CopyHelper(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = RHS->CurArraySize;
  this->CurArraySize = uVar1;
  uVar2 = RHS->NumNonEmpty;
  if (RHS->CurArray == RHS->SmallArray) {
    uVar1 = uVar2;
  }
  if (uVar1 != 0) {
    memmove(this->CurArray,RHS->CurArray,(ulong)uVar1 << 3);
    uVar2 = RHS->NumNonEmpty;
  }
  this->NumNonEmpty = uVar2;
  this->NumTombstones = RHS->NumTombstones;
  return;
}

Assistant:

void SmallPtrSetImplBase::CopyHelper(const SmallPtrSetImplBase &RHS) {
  // Copy over the new array size
  CurArraySize = RHS.CurArraySize;

  // Copy over the contents from the other set
  std::copy(RHS.CurArray, RHS.EndPointer(), CurArray);

  NumNonEmpty = RHS.NumNonEmpty;
  NumTombstones = RHS.NumTombstones;
}